

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::setup(HFactor *this,HighsSparseMatrix *a_matrix,
              vector<int,_std::allocator<int>_> *basic_index,double pivot_threshold,
              double pivot_tolerance,HighsInt highs_debug_level,HighsLogOptions *log_options)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  HighsLogOptions *unaff_retaddr;
  HighsInt in_stack_0000000c;
  double in_stack_00000010;
  double in_stack_00000018;
  HighsInt basic_index_size;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  if (0 < (int)sVar1) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7c8854);
    setupGeneral((HFactor *)pivot_threshold,(HighsSparseMatrix *)pivot_tolerance,highs_debug_level,
                 (HighsInt *)log_options,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                 unaff_retaddr);
  }
  return;
}

Assistant:

void HFactor::setup(const HighsSparseMatrix& a_matrix,
                    std::vector<HighsInt>& basic_index,
                    const double pivot_threshold, const double pivot_tolerance,
                    const HighsInt highs_debug_level,
                    const HighsLogOptions* log_options) {
  HighsInt basic_index_size = basic_index.size();
  // Nothing to do if basic index has no entries, and mustn't try to
  // pass the pointer to entry 0 of a vector of size 0.
  if (basic_index_size <= 0) return;
  this->setupGeneral(&a_matrix, basic_index_size, basic_index.data(),
                     pivot_threshold, pivot_tolerance, highs_debug_level,
                     log_options);
  return;
}